

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_sse(Mat *kernel,Mat *kernel_tm,int inch,int outch)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  float *pfVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  float *pfVar19;
  ulong uVar20;
  float tmp [4] [3];
  float afStack_70 [6];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  afStack_70[0] = 1.76826e-39;
  afStack_70[1] = 0.0;
  Mat::create(kernel_tm,0x10,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar11 = kernel->data;
    iVar10 = kernel_tm->w;
    pfVar14 = (float *)kernel_tm->data;
    sVar12 = kernel_tm->elemsize;
    sVar13 = kernel_tm->cstep;
    uVar15 = 0;
    do {
      if (0 < inch) {
        iVar16 = inch * 9 * (int)uVar15;
        uVar20 = 0;
        pfVar19 = pfVar14;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar20 * 0x24 + (long)iVar16 * 4 + 0x20);
          local_58 = fVar6 * 0.5 + fVar5 * 0.5 + fVar4 * 0.5;
          fStack_54 = fVar9 * 0.5 + fVar8 * 0.5 + fVar7 * 0.5;
          fStack_50 = fVar3 * 0.5 + fVar2 * -0.5 + fVar1 * 0.5;
          fStack_4c = fVar6 * 0.5 + fVar5 * -0.5 + fVar4 * 0.5;
          afStack_70[2] = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 1.0;
          afStack_70[3] = fVar6 * 0.0 + fVar5 * 0.0 + fVar4 * 1.0;
          afStack_70[4] = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 1.0;
          afStack_70[5] = fVar3 * 0.5 + fVar2 * 0.5 + fVar1 * 0.5;
          local_48 = fVar9 * 0.5 + fVar8 * -0.5 + fVar7 * 0.5;
          fStack_44 = fVar3 * 1.0 + fVar2 * 0.0 + fVar1 * 0.0;
          fStack_40 = fVar6 * 1.0 + fVar5 * 0.0 + fVar4 * 0.0;
          fStack_3c = fVar9 * 1.0 + fVar8 * 0.0 + fVar7 * 0.0;
          lVar17 = 8;
          pfVar18 = pfVar19;
          do {
            fVar1 = *(float *)((long)afStack_70 + lVar17);
            fVar2 = *(float *)((long)afStack_70 + lVar17 + 4);
            fVar3 = *(float *)((long)afStack_70 + lVar17 + 8);
            *pfVar18 = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 1.0;
            pfVar18[1] = fVar3 * 0.5 + fVar2 * 0.5 + fVar1 * 0.5;
            pfVar18[2] = fVar3 * 0.5 + fVar2 * -0.5 + fVar1 * 0.5;
            pfVar18[3] = fVar3 * 1.0 + fVar2 * 0.0 + fVar1 * 0.0;
            pfVar18 = pfVar18 + 4;
            lVar17 = lVar17 + 0xc;
          } while (lVar17 != 0x38);
          uVar20 = uVar20 + 1;
          pfVar19 = (float *)((long)pfVar19 + (long)iVar10 * sVar12);
        } while (uVar20 != (uint)inch);
      }
      uVar15 = uVar15 + 1;
      pfVar14 = (float *)((long)pfVar14 + sVar13 * sVar12);
    } while (uVar15 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch)
{
    kernel_tm.create(4*4, inch, outch);

    // G
    const float ktm[4][3] = {
        {   1.0f,     0.0f,     0.0f},
        { 1.0f/2,   1.0f/2,   1.0f/2},
        { 1.0f/2,  -1.0f/2,   1.0f/2},
        {   0.0f,     0.0f,     1.0f}
    };

    #pragma omp parallel for
    for (int p = 0; p<outch; p++)
    {
        for (int q = 0; q<inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p*inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i=0; i<4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j=0; j<4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i=0; i<4; i++)
                {
                    kernel_tm0[j*4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}